

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

reverse_iterator __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
rbegin(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this)

{
  Rep *pRVar1;
  void **ppvVar2;
  RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  
  pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
  ppvVar2 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar2 = (void **)0x0;
  }
  *in_RDI.it_ = ppvVar2 + (this->super_RepeatedPtrFieldBase).current_size_;
  return (reverse_iterator)
         (RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )in_RDI.it_;
}

Assistant:

reverse_iterator rbegin() { return reverse_iterator(end()); }